

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O3

void printDeviceList(void)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  ulong uVar6;
  DWORD numDevs;
  uint local_7c;
  void *local_78;
  string local_70;
  string local_50;
  
  local_7c = 0;
  iVar1 = FT_CreateDeviceInfoList();
  if (iVar1 == 0) {
    if (local_7c != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Devices: ",9);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      local_78 = malloc((ulong)local_7c * 0x68);
      iVar1 = FT_GetDeviceInfoList(local_78,&local_7c);
      if (iVar1 == 0) {
        if (local_7c != 0) {
          pcVar5 = (char *)((long)local_78 + 0x20);
          uVar6 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            sVar2 = strlen(pcVar5);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,pcVar5,pcVar5 + sVar2);
            descriptionToName(&local_70,&local_50);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            uVar6 = uVar6 + 1;
            pcVar5 = pcVar5 + 0x68;
          } while (uVar6 < local_7c);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error getting device list!",0x1a);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
        std::ostream::put(-0x38);
        std::ostream::flush();
      }
      free(local_78);
      return;
    }
    poVar4 = (ostream *)&std::cout;
    pcVar5 = "No devices found!";
    lVar3 = 0x11;
  }
  else {
    poVar4 = (ostream *)&std::cerr;
    pcVar5 = "Could not read device list!";
    lVar3 = 0x1b;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,lVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void printDeviceList() {
    FT_STATUS ftStatus;
    FT_DEVICE_LIST_INFO_NODE *devInfo;
    DWORD numDevs = 0;
    // create the device information list
    ftStatus = FT_CreateDeviceInfoList(&numDevs);
    if (ftStatus != FT_OK) {
        cerr << "Could not read device list!" << endl;
        return;
    }

    if (numDevs > 0) {
        cout << "Devices: " << endl;
        // allocate storage for list based on numDevs
        devInfo = (FT_DEVICE_LIST_INFO_NODE *) malloc(
                sizeof(FT_DEVICE_LIST_INFO_NODE) * numDevs);
        // get the device information list
        ftStatus = FT_GetDeviceInfoList(devInfo, &numDevs);
        if (ftStatus == FT_OK) {
            for (unsigned int i = 0; i < numDevs; i++) {
                cout << "  " << i << ": "
                     << descriptionToName(devInfo[i].Description) << endl;
            }
        } else {
            cerr << "Error getting device list!" << endl;
        }
        free(devInfo);
    } else {
        cout << "No devices found!" << endl;
    }
}